

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void __thiscall google::protobuf::io::Tokenizer::~Tokenizer(Tokenizer *this)

{
  if (this->buffer_pos_ < this->buffer_size_) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])();
  }
  std::__cxx11::string::~string((string *)&(this->previous_).text);
  std::__cxx11::string::~string((string *)&(this->current_).text);
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
  // If we had any buffer left unread, return it to the underlying stream
  // so that someone else can read it.
  if (buffer_size_ > buffer_pos_) {
    input_->BackUp(buffer_size_ - buffer_pos_);
  }
}